

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_CustomArg_Test::~ArgTest_CustomArg_Test(ArgTest_CustomArg_Test *this)

{
  void *in_RDI;
  
  ~ArgTest_CustomArg_Test((ArgTest_CustomArg_Test *)0x12c648);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ArgTest, CustomArg) {
  test_struct test;
  typedef mock_visitor<fmt::basic_format_arg<fmt::format_context>::handle>
    visitor;
  testing::StrictMock<visitor> v;
  EXPECT_CALL(v, visit(_)).WillOnce(testing::Invoke(check_custom()));
  fmt::visit(v, make_arg<fmt::format_context>(test));
}